

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

void decodeModrm(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  UIntPtr UVar1;
  int iVar2;
  uint uVar3;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar2 = Security(2,pMyDisasm);
  if (iVar2 != 0) {
    UVar1 = (pMyDisasm->Reserved_).EIP_;
    uVar3 = (uint)(*(byte *)(UVar1 + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar3;
    (pMyDisasm->Reserved_).RM_ = *(byte *)(UVar1 + 1) & 7;
    (*(code *)(&DAT_00137904 + *(int *)(&DAT_00137904 + (ulong)uVar3 * 4)))();
    return;
  }
  return;
}

Assistant:

void __bea_callspec__ decodeModrm(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
  UInt8* modrm;
  GV.DECALAGE_EIP = 0;
  if (!Security(2, pMyDisasm)) return;
  modrm = (UInt8*) (GV.EIP_ + 1);
  GV.MOD_ = (*modrm >> 6) & 0x3;
  GV.RM_  = *modrm & 0x7;
  switch(GV.MOD_) {
    case 0:
      ModRM_0[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 1:
      GV.DECALAGE_EIP++;
      if (!Security(3, pMyDisasm)) return;
      ModRM_1[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 2:
      if (GV.AddressSize >= 32) {
        GV.DECALAGE_EIP += 4;
        if (!Security(6, pMyDisasm)) return;
      }
      else {
        GV.DECALAGE_EIP += 2;
        if (!Security(4, pMyDisasm)) return;
      }
      ModRM_2[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 3:
      ModRM_3[GV.RM_](pMyOperand, pMyDisasm);
  }
}